

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::method_base_*>,_phmap::priv::HashEq<cs::method_base_*,_void>::Hash,_phmap::priv::HashEq<cs::method_base_*,_void>::Eq,_std::allocator<cs::method_base_*>_>
::drop_deletes_without_resize
          (raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::method_base_*>,_phmap::priv::HashEq<cs::method_base_*,_void>::Hash,_phmap::priv::HashEq<cs::method_base_*,_void>::Eq,_std::allocator<cs::method_base_*>_>
           *this)

{
  char *pcVar1;
  byte *pbVar2;
  ulong uVar3;
  ctrl_t *pcVar4;
  slot_type *ppmVar5;
  slot_type pmVar6;
  undefined1 auVar7 [16];
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  undefined8 uVar23;
  ctrl_t *pcVar24;
  size_t sVar25;
  ulong uVar26;
  ulong uVar27;
  byte bVar28;
  size_t i;
  FindInfo FVar29;
  
  uVar3 = this->capacity_;
  if ((uVar3 == 0) || ((uVar3 + 1 & uVar3) != 0)) {
    __assert_fail("IsValidCapacity(capacity_)",
                  "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                  ,0x8f8,
                  "void phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::method_base *>, phmap::priv::HashEq<cs::method_base *>::Hash, phmap::priv::HashEq<cs::method_base *>::Eq, std::allocator<cs::method_base *>>::drop_deletes_without_resize() [Policy = phmap::priv::FlatHashSetPolicy<cs::method_base *>, Hash = phmap::priv::HashEq<cs::method_base *>::Hash, Eq = phmap::priv::HashEq<cs::method_base *>::Eq, Alloc = std::allocator<cs::method_base *>]"
                 );
  }
  if (uVar3 < 0xf) {
    __assert_fail("!is_small()",
                  "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                  ,0x8f9,
                  "void phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::method_base *>, phmap::priv::HashEq<cs::method_base *>::Hash, phmap::priv::HashEq<cs::method_base *>::Eq, std::allocator<cs::method_base *>>::drop_deletes_without_resize() [Policy = phmap::priv::FlatHashSetPolicy<cs::method_base *>, Hash = phmap::priv::HashEq<cs::method_base *>::Hash, Eq = phmap::priv::HashEq<cs::method_base *>::Eq, Alloc = std::allocator<cs::method_base *>]"
                 );
  }
  pcVar4 = this->ctrl_;
  if (pcVar4[uVar3] != -1) {
    __assert_fail("ctrl[capacity] == kSentinel",
                  "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                  ,0x270,"void phmap::priv::ConvertDeletedToEmptyAndFullToDeleted(ctrl_t *, size_t)"
                 );
  }
  pcVar24 = pcVar4 + uVar3;
  if (pcVar24 + 1 != pcVar4) {
    uVar27 = 0;
    do {
      pcVar1 = pcVar4 + uVar27;
      cVar8 = pcVar1[1];
      cVar9 = pcVar1[2];
      cVar10 = pcVar1[3];
      cVar11 = pcVar1[4];
      cVar12 = pcVar1[5];
      cVar13 = pcVar1[6];
      cVar14 = pcVar1[7];
      cVar15 = pcVar1[8];
      cVar16 = pcVar1[9];
      cVar17 = pcVar1[10];
      cVar18 = pcVar1[0xb];
      cVar19 = pcVar1[0xc];
      cVar20 = pcVar1[0xd];
      cVar21 = pcVar1[0xe];
      cVar22 = pcVar1[0xf];
      pbVar2 = (byte *)(pcVar4 + uVar27);
      *pbVar2 = -(*pcVar1 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[1] = -(cVar8 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[2] = -(cVar9 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[3] = -(cVar10 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[4] = -(cVar11 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[5] = -(cVar12 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[6] = -(cVar13 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[7] = -(cVar14 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[8] = -(cVar15 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[9] = -(cVar16 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[10] = -(cVar17 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xb] = -(cVar18 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xc] = -(cVar19 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xd] = -(cVar20 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xe] = -(cVar21 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xf] = -(cVar22 < '\0') & 0x7eU ^ 0xfe;
      uVar27 = uVar27 + 0x10;
    } while (uVar3 + 1 != uVar27);
  }
  uVar23 = *(undefined8 *)(pcVar4 + 8);
  *(undefined8 *)(pcVar24 + 1) = *(undefined8 *)pcVar4;
  *(undefined8 *)(pcVar24 + 9) = uVar23;
  *pcVar24 = -1;
  sVar25 = this->capacity_;
  if (sVar25 != 0) {
    i = 0;
    do {
      if (this->ctrl_[i] == -2) {
        auVar7._8_8_ = 0;
        auVar7._0_8_ = this->slots_[i];
        uVar27 = SUB168(ZEXT816(0xde5fb9d2630458e9) * auVar7,8) +
                 SUB168(ZEXT816(0xde5fb9d2630458e9) * auVar7,0);
        FVar29 = find_first_non_full(this,uVar27);
        sVar25 = FVar29.offset;
        uVar3 = this->capacity_;
        if ((uVar3 + 1 & uVar3) != 0) {
          __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                        ,0x96,"phmap::priv::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]");
        }
        uVar26 = uVar27 >> 7 & uVar3;
        bVar28 = (byte)uVar27;
        if (((i - uVar26 ^ sVar25 - uVar26) & uVar3) < 0x10) {
          bVar28 = bVar28 & 0x7f;
        }
        else {
          if (this->ctrl_[sVar25] == -2) {
            set_ctrl(this,sVar25,bVar28 & 0x7f);
            ppmVar5 = this->slots_;
            pmVar6 = ppmVar5[i];
            ppmVar5[i] = ppmVar5[sVar25];
            this->slots_[sVar25] = pmVar6;
            i = i - 1;
            goto LAB_00188234;
          }
          if (this->ctrl_[sVar25] != -0x80) {
            __assert_fail("IsDeleted(ctrl_[new_i])",
                          "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                          ,0x92b,
                          "void phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<cs::method_base *>, phmap::priv::HashEq<cs::method_base *>::Hash, phmap::priv::HashEq<cs::method_base *>::Eq, std::allocator<cs::method_base *>>::drop_deletes_without_resize() [Policy = phmap::priv::FlatHashSetPolicy<cs::method_base *>, Hash = phmap::priv::HashEq<cs::method_base *>::Hash, Eq = phmap::priv::HashEq<cs::method_base *>::Eq, Alloc = std::allocator<cs::method_base *>]"
                         );
          }
          set_ctrl(this,sVar25,bVar28 & 0x7f);
          this->slots_[sVar25] = this->slots_[i];
          bVar28 = 0x80;
        }
        set_ctrl(this,i,bVar28);
      }
LAB_00188234:
      i = i + 1;
      sVar25 = this->capacity_;
    } while (i != sVar25);
  }
  reset_growth_left(this,sVar25);
  return;
}

Assistant:

void drop_deletes_without_resize() PHMAP_ATTRIBUTE_NOINLINE {
				assert(IsValidCapacity(capacity_));
				assert(!is_small());
				// Algorithm:
				// - mark all DELETED slots as EMPTY
				// - mark all FULL slots as DELETED
				// - for each slot marked as DELETED
				//     hash = Hash(element)
				//     target = find_first_non_full(hash)
				//     if target is in the same group
				//       mark slot as FULL
				//     else if target is EMPTY
				//       transfer element to target
				//       mark slot as EMPTY
				//       mark target as FULL
				//     else if target is DELETED
				//       swap current element with target element
				//       mark target as FULL
				//       repeat procedure for current slot with moved from element (target)
				ConvertDeletedToEmptyAndFullToDeleted(ctrl_, capacity_);
				typename phmap::aligned_storage<sizeof(slot_type), alignof(slot_type)>::type
				raw;
				slot_type* slot = reinterpret_cast<slot_type*>(&raw);
				for (size_t i = 0; i != capacity_; ++i)
				{
					if (!IsDeleted(ctrl_[i])) continue;
					size_t hashval = PolicyTraits::apply(HashElement{hash_ref()},
					PolicyTraits::element(slots_ + i));
					auto target = find_first_non_full(hashval);
					size_t new_i = target.offset;

					// Verify if the old and new i fall within the same group wrt the hashval.
					// If they do, we don't need to move the object as it falls already in the
					// best probe we can.
					const auto probe_index = [&](size_t pos) {
						return ((pos - probe(hashval).offset()) & capacity_) / Group::kWidth;
					};

					// Element doesn't move.
					if (PHMAP_PREDICT_TRUE(probe_index(new_i) == probe_index(i))) {
						set_ctrl(i, H2(hashval));
						continue;
					}
					if (IsEmpty(ctrl_[new_i])) {
						// Transfer element to the empty spot.
						// set_ctrl poisons/unpoisons the slots so we have to call it at the
						// right time.
						set_ctrl(new_i, H2(hashval));
						PolicyTraits::transfer(&alloc_ref(), slots_ + new_i, slots_ + i);
						set_ctrl(i, kEmpty);
					}
					else {
						assert(IsDeleted(ctrl_[new_i]));
						set_ctrl(new_i, H2(hashval));
						// Until we are done rehashing, DELETED marks previously FULL slots.
						// Swap i and new_i elements.
						PolicyTraits::transfer(&alloc_ref(), slot, slots_ + i);
						PolicyTraits::transfer(&alloc_ref(), slots_ + i, slots_ + new_i);
						PolicyTraits::transfer(&alloc_ref(), slots_ + new_i, slot);
						--i;  // repeat
					}
				}
				reset_growth_left(capacity_);
			}